

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2pShaderControlStatementTests.cpp
# Opt level: O2

int __thiscall
deqp::gles2::Performance::ControlStatementCase::init(ControlStatementCase *this,EVP_PKEY_CTX *ctx)

{
  ostringstream *this_00;
  int iVar1;
  EVP_PKEY_CTX *ctx_00;
  undefined1 local_190 [384];
  
  local_190._0_8_ =
       ((this->super_ShaderPerformanceCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  this_00 = (ostringstream *)(local_190 + 8);
  std::__cxx11::ostringstream::ostringstream(this_00);
  std::operator<<((ostream *)this_00,"Using additive blending.");
  ctx_00 = (EVP_PKEY_CTX *)&tcu::TestLog::EndMessage;
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_190,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(this_00);
  iVar1 = deqp::gls::ShaderPerformanceCase::init(&this->super_ShaderPerformanceCase,ctx_00);
  return iVar1;
}

Assistant:

void init (void)
	{
		m_testCtx.getLog() << TestLog::Message << "Using additive blending." << TestLog::EndMessage;
		ShaderPerformanceCase::init();
	}